

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  bool bVar1;
  undefined1 local_44 [4];
  int status;
  RTPIPv4Destination dest;
  RTPAddress *addr_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else {
    dest.rtcpaddr.sin_zero = (uchar  [8])addr;
    RTPIPv4Destination::RTPIPv4Destination((RTPIPv4Destination *)local_44);
    bVar1 = RTPIPv4Destination::AddressToDestination
                      ((RTPAddress *)dest.rtcpaddr.sin_zero,(RTPIPv4Destination *)local_44);
    if (bVar1) {
      this_local._4_4_ =
           RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
           ::DeleteElement(&this->destinations,(RTPIPv4Destination *)local_44);
    }
    else {
      this_local._4_4_ = -0x54;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}